

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O2

void __thiscall
yactfr::internal::JsonIntRangeSetValReqBase<yactfr::internal::JsonSIntValReq>::
JsonIntRangeSetValReqBase(JsonIntRangeSetValReqBase<yactfr::internal::JsonSIntValReq> *this)

{
  Sp local_50;
  optional<unsigned_long_long> local_40;
  optional<unsigned_long_long> local_30;
  
  local_30.super_type.m_initialized = true;
  local_30.super_type.m_storage = 1;
  local_40.super_type.m_initialized = false;
  JsonIntRangeValReqBase<yactfr::internal::JsonSIntValReq>::shared();
  JsonArrayValReq::JsonArrayValReq(&this->super_JsonArrayValReq,&local_30,&local_40,&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.
              super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (this->super_JsonArrayValReq).super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonArrayValReq_00360188;
  return;
}

Assistant:

explicit JsonIntRangeSetValReqBase() :
        JsonArrayValReq {1, boost::none, JsonIntRangeValReqBase<JsonIntValReqT>::shared()}
    {
    }